

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_queue.c
# Opt level: O2

void ngx_queue_sort(ngx_queue_t *queue,_func_ngx_int_t_ngx_queue_t_ptr_ngx_queue_t_ptr *cmp)

{
  ngx_queue_t *pnVar1;
  ngx_queue_t *pnVar2;
  ngx_int_t nVar3;
  ngx_queue_t *pnVar4;
  ngx_queue_t *pnVar5;
  
  if (queue->next != queue->prev) {
    pnVar5 = queue->next->next;
    while (pnVar5 != queue) {
      pnVar4 = pnVar5->prev;
      pnVar1 = pnVar5->next;
      pnVar1->prev = pnVar4;
      pnVar4->next = pnVar1;
      pnVar5->prev = (ngx_queue_t *)0x0;
      pnVar5->next = (ngx_queue_t *)0x0;
      do {
        nVar3 = (*cmp)(pnVar4,pnVar5);
        if (nVar3 < 1) break;
        pnVar4 = pnVar4->prev;
      } while (pnVar4 != queue);
      pnVar2 = pnVar4->next;
      pnVar5->next = pnVar2;
      pnVar2->prev = pnVar5;
      pnVar5->prev = pnVar4;
      pnVar4->next = pnVar5;
      pnVar5 = pnVar1;
    }
  }
  return;
}

Assistant:

void
ngx_queue_sort(ngx_queue_t *queue,
    ngx_int_t (*cmp)(const ngx_queue_t *, const ngx_queue_t *))
{
    ngx_queue_t  *q, *prev, *next;

    q = ngx_queue_head(queue);

    if (q == ngx_queue_last(queue)) {
        return;
    }

    for (q = ngx_queue_next(q); q != ngx_queue_sentinel(queue); q = next) {

        prev = ngx_queue_prev(q);
        next = ngx_queue_next(q);

        ngx_queue_remove(q);

        do {
            if (cmp(prev, q) <= 0) {
                break;
            }

            prev = ngx_queue_prev(prev);

        } while (prev != ngx_queue_sentinel(queue));

        ngx_queue_insert_after(prev, q);
    }
}